

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

int run_test_poll_unidirectional(void)

{
  test_mode = 1;
  start_poll_test();
  return 0;
}

Assistant:

TEST_IMPL(poll_unidirectional) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  test_mode = UNIDIRECTIONAL;
  start_poll_test();
  return 0;
}